

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderViewPrivate::setHeaderMode(QHeaderViewPrivate *this,HeaderMode mode)

{
  QObject *o;
  qsizetype qVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->headerMode != mode) {
    o = *(QObject **)
         &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
          super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    this->headerMode = mode;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_38,o);
    if (mode == InitialNoSectionMemoryUsage) {
      qVar1 = (this->sectionItems).d.size;
      this->countInNoSectionItemsMode = 0;
      QList<QHeaderViewPrivate::SectionItem>::clear(&this->sectionItems);
      QList<int>::clear(&this->visualIndices);
      QList<int>::clear(&this->logicalIndices);
      QHash<int,_int>::clear(&this->hiddenSectionSize);
      QHash<int,_int>::clear(&this->cascadingSectionSize);
      updateCountInNoSectionItemsMode(this,(int)qVar1);
    }
    else {
      this->length = 0;
      this->countInNoSectionItemsMode = 0;
      QHeaderView::initializeSections((QHeaderView *)o);
    }
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderViewPrivate::setHeaderMode(HeaderMode mode)
{
    Q_Q(QHeaderView);

    if (mode == headerMode)
        return;

    const bool avoidSectionMemoryUsage = (mode == HeaderMode::InitialNoSectionMemoryUsage);
    headerMode = mode;

    QSignalBlocker b(q); // Avoid emit of section count changed.
    if (avoidSectionMemoryUsage) {
        const int sectionCount = sectionItems.count();
        countInNoSectionItemsMode = 0;
        sectionItems.clear();
        visualIndices.clear();
        logicalIndices.clear();
        hiddenSectionSize.clear();
        cascadingSectionSize.clear();
        updateCountInNoSectionItemsMode(sectionCount);
    }
    else {
        length = 0;
        countInNoSectionItemsMode = 0;
        q->initializeSections();
    }
}